

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mediator_test.cc
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ConcreteMediator *this;
  Colleague *this_00;
  Colleague *this_01;
  Colleague *this_02;
  int value_c3;
  int value_c2;
  int value_c1;
  Colleague *c3;
  Colleague *c2;
  Colleague *c1;
  Mediator *mediator;
  
  this = (ConcreteMediator *)operator_new(0x20);
  ConcreteMediator::ConcreteMediator(this);
  this_00 = (Colleague *)operator_new(0x18);
  ConcreteColleague::ConcreteColleague((ConcreteColleague *)this_00,(Mediator *)this);
  this_01 = (Colleague *)operator_new(0x18);
  ConcreteColleague::ConcreteColleague((ConcreteColleague *)this_01,(Mediator *)this);
  this_02 = (Colleague *)operator_new(0x18);
  ConcreteColleague::ConcreteColleague((ConcreteColleague *)this_02,(Mediator *)this);
  (**(this->super_Mediator)._vptr_Mediator)(this,this_00);
  (**(this->super_Mediator)._vptr_Mediator)(this,this_01);
  (**(this->super_Mediator)._vptr_Mediator)(this,this_02);
  (**this_00->_vptr_Colleague)(this_00,10);
  iVar1 = Colleague::getValue(this_00);
  iVar2 = Colleague::getValue(this_01);
  iVar3 = Colleague::getValue(this_02);
  if (iVar1 != 10) {
    __assert_fail("value_c1 == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/mediator_test.cc"
                  ,0x16,"int main()");
  }
  if (iVar2 != 10) {
    __assert_fail("value_c2 == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/mediator_test.cc"
                  ,0x17,"int main()");
  }
  if (iVar3 != 10) {
    __assert_fail("value_c3 == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/mediator_test.cc"
                  ,0x18,"int main()");
  }
  (**this_00->_vptr_Colleague)(this_00,0x58);
  iVar1 = Colleague::getValue(this_00);
  iVar2 = Colleague::getValue(this_01);
  iVar3 = Colleague::getValue(this_02);
  if (iVar1 == 0x58) {
    if (iVar2 != 0x58) {
      __assert_fail("value_c2 == 88",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/mediator_test.cc"
                    ,0x1f,"int main()");
    }
    if (iVar3 == 0x58) {
      return 0;
    }
    __assert_fail("value_c3 == 88",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/mediator_test.cc"
                  ,0x20,"int main()");
  }
  __assert_fail("value_c1 == 88",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/behavioral/mediator_test.cc"
                ,0x1e,"int main()");
}

Assistant:

int main() {
  Mediator* mediator = new ConcreteMediator;

  Colleague* c1 = new ConcreteColleague(mediator);
  Colleague* c2 = new ConcreteColleague(mediator);
  Colleague* c3 = new ConcreteColleague(mediator);

  mediator->add(c1);
  mediator->add(c2);
  mediator->add(c3);

  c1->gossip(10);
  int value_c1 = c1->getValue();
  int value_c2 = c2->getValue();
  int value_c3 = c3->getValue();
  assert(value_c1 == 10);
  assert(value_c2 == 10);
  assert(value_c3 == 10);

  c1->gossip(88);
  value_c1 = c1->getValue();
  value_c2 = c2->getValue();
  value_c3 = c3->getValue();
  assert(value_c1 == 88);
  assert(value_c2 == 88);
  assert(value_c3 == 88);
}